

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_eval(REF_GEOM ref_geom,REF_INT geom,REF_DBL *xyz,REF_DBL *dxyz_dtuv)

{
  REF_STATUS RVar1;
  
  RVar1 = 3;
  if ((-1 < geom) && (geom < ref_geom->max)) {
    ref_egads_eval_at(ref_geom,ref_geom->descr[(uint)(geom * 6)],
                      ref_geom->descr[(ulong)(uint)(geom * 6) + 1],dxyz_dtuv,xyz,dxyz_dtuv);
    RVar1 = 6;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xdeb,
           "ref_egads_eval",6,"eval at");
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_egads_eval(REF_GEOM ref_geom, REF_INT geom, REF_DBL *xyz,
                                  REF_DBL *dxyz_dtuv) {
  REF_INT type, id, i;
  REF_DBL params[2];
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  params[0] = 0.0;
  params[1] = 0.0;
  type = ref_geom_type(ref_geom, geom);
  id = ref_geom_id(ref_geom, geom);

  for (i = 0; i < type; i++) {
    params[i] = ref_geom_param(ref_geom, i, geom);
  }
  RSS(ref_egads_eval_at(ref_geom, type, id, params, xyz, dxyz_dtuv), "eval at");
  return REF_SUCCESS;
}